

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O3

void ustring_suite::test_empty(void)

{
  uchar input [3];
  udecoder_type decoder;
  undefined4 local_188;
  value_type_conflict local_184 [4];
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
  local_180;
  basic_decoder<unsigned_char> local_160;
  
  local_160.input.tail = local_184 + 2;
  local_184[2] = 0;
  local_184[0] = '\"';
  local_184[1] = '\"';
  local_160.input.head = local_184;
  memset(&local_160.current,0,0x120);
  local_160.current.code = uninitialized;
  local_160.current.view.head = (const_pointer)0x0;
  local_160.current.view.tail = (const_pointer)0x0;
  trial::protocol::json::detail::basic_decoder<unsigned_char>::assume_next(&local_160);
  local_180._M_dataplus._M_p._0_4_ = local_160.current.code;
  local_188 = 10;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x73d,"void ustring_suite::test_empty()",&local_180,&local_188);
  trial::protocol::json::detail::basic_decoder<unsigned_char>::
  string_value<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
            (&local_180,&local_160);
  boost::detail::test_impl
            ("decoder.string_value<ustring_type>().empty()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x73e,"void ustring_suite::test_empty()",local_180._M_string_length == 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  local_180._M_dataplus._M_p = local_160.current.view.tail + -(long)local_160.current.view.head;
  local_188 = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("decoder.literal().size()","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x73f,"void ustring_suite::test_empty()",&local_180,&local_188);
  local_188._0_1_ = 0x22;
  local_180._M_dataplus._M_p._0_1_ = *local_160.current.view.head;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,char>
            ("decoder.literal()[0]","\'\"\'",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x740,"void ustring_suite::test_empty()",&local_180,&local_188);
  local_180._M_dataplus._M_p._0_1_ = local_160.current.view.head[1];
  local_188 = CONCAT31(local_188._1_3_,0x22);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,char>
            ("decoder.literal()[1]","\'\"\'",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x741,"void ustring_suite::test_empty()",&local_180,&local_188);
  if (error_unexpected_token < local_160.current.code) {
    if (local_160.current.code == end) {
      local_160.current.code = error_unexpected_token;
    }
    else {
      trial::protocol::json::detail::basic_decoder<unsigned_char>::assume_next(&local_160);
    }
  }
  local_180._M_dataplus._M_p._0_4_ = local_160.current.code;
  local_188 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x743,"void ustring_suite::test_empty()",&local_180,&local_188);
  return;
}

Assistant:

void test_empty()
{
    const unsigned char input[] = { '"', '"', 0 };
    udecoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::string);
    TRIAL_PROTOCOL_TEST(decoder.string_value<ustring_type>().empty());
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.literal().size(), 2);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.literal()[0], '"');
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.literal()[1], '"');
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}